

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStream_SetUpBuffers(PaAlsaStream *self,unsigned_long *numFrames,int *xrunOccurred)

{
  int iVar1;
  PaError PVar2;
  snd_pcm_t **ppsVar3;
  char *format;
  unsigned_long frameCount;
  int xrun;
  unsigned_long playbackFrames;
  unsigned_long captureFrames;
  int local_4c;
  unsigned_long local_48;
  unsigned_long local_40;
  ulong local_38;
  ulong uVar4;
  
  local_40 = 0xffffffffffffffff;
  local_48 = 0xffffffffffffffff;
  local_4c = 0;
  if (*xrunOccurred != 0) {
    *numFrames = 0;
    return 0;
  }
  if ((self->capture).ready != 0) {
    if ((self->capture).pcm == (snd_pcm_t *)0x0) goto LAB_00111c3e;
    local_40 = *numFrames;
    paUtilErr_ = PaAlsaStreamComponent_RegisterChannels
                           (&self->capture,&self->bufferProcessor,&local_40,&local_4c);
    if (-1 < paUtilErr_) goto LAB_00111c3e;
    format = 
    "Expression \'PaAlsaStreamComponent_RegisterChannels( &self->capture, &self->bufferProcessor, &captureFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4093\n"
    ;
LAB_00111d7d:
    PaUtil_DebugPrint(format);
    local_38 = (ulong)(uint)paUtilErr_;
    uVar4 = local_38;
    iVar1 = local_4c;
    goto LAB_00111cb3;
  }
  if ((self->playback).ready == 0) {
    PaUtil_DebugPrint(
                     "Expression \'self->capture.ready || self->playback.ready\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4084\n"
                     );
    local_38 = 0xffffd8fe;
    uVar4 = local_38;
    iVar1 = local_4c;
    goto LAB_00111cb3;
  }
LAB_00111c3e:
  ppsVar3 = &(self->capture).pcm;
  if (((self->playback).pcm != (snd_pcm_t *)0x0) && ((self->playback).ready != 0)) {
    local_48 = *numFrames;
    paUtilErr_ = PaAlsaStreamComponent_RegisterChannels
                           (&self->playback,&self->bufferProcessor,&local_48,&local_4c);
    if (paUtilErr_ < 0) {
      format = 
      "Expression \'PaAlsaStreamComponent_RegisterChannels( &self->playback, &self->bufferProcessor, &playbackFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4099\n"
      ;
      goto LAB_00111d7d;
    }
  }
  if (local_4c == 0) {
    frameCount = local_48;
    if (local_40 < local_48) {
      frameCount = local_40;
    }
    if (*numFrames < frameCount) goto LAB_00111c9f;
    if (*ppsVar3 != (snd_pcm_t *)0x0) {
      if ((self->capture).ready == 0) {
        PaUtil_SetNoInput(&self->bufferProcessor);
      }
      else {
        PaUtil_SetInputFrameCount(&self->bufferProcessor,frameCount);
      }
    }
    if ((self->playback).pcm != (snd_pcm_t *)0x0) {
      if ((self->playback).ready == 0) {
        if (self->neverDropInput == 0) {
          __assert_fail("self->neverDropInput",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                        ,0x103a,
                        "PaError PaAlsaStream_SetUpBuffers(PaAlsaStream *, unsigned long *, int *)")
          ;
        }
        if (*ppsVar3 == (snd_pcm_t *)0x0) {
          __assert_fail("self->capture.pcm != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                        ,0x103b,
                        "PaError PaAlsaStream_SetUpBuffers(PaAlsaStream *, unsigned long *, int *)")
          ;
        }
        PaUtil_SetNoOutput(&self->bufferProcessor);
      }
      else {
        PaUtil_SetOutputFrameCount(&self->bufferProcessor,frameCount);
      }
    }
  }
  else {
LAB_00111c9f:
    frameCount = 0;
  }
  local_38 = 0;
  *numFrames = frameCount;
  uVar4 = local_38;
  iVar1 = local_4c;
LAB_00111cb3:
  do {
    PVar2 = (PaError)uVar4;
    if (iVar1 == 0) {
      PVar2 = (PaError)local_38;
LAB_00111cee:
      *xrunOccurred = iVar1;
      return PVar2;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun(self);
    if (-1 < paUtilErr_) {
      *numFrames = 0;
      goto LAB_00111cee;
    }
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStream_HandleXrun( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4166\n"
                     );
    uVar4 = (ulong)(uint)paUtilErr_;
  } while( true );
}

Assistant:

static PaError PaAlsaStream_SetUpBuffers( PaAlsaStream* self, unsigned long* numFrames, int* xrunOccurred )
{
    PaError result = paNoError;
    unsigned long captureFrames = ULONG_MAX, playbackFrames = ULONG_MAX, commonFrames = 0;
    int xrun = 0;

    if( *xrunOccurred )
    {
        *numFrames = 0;
        return result;
    }
    /* If we got here at least one of the pcm's should be marked ready */
    PA_UNLESS( self->capture.ready || self->playback.ready, paInternalError );

    /* Extract per-channel ALSA buffer pointers and register them with the buffer processor.
     * It is possible that a direction is not marked ready however, because it is out of sync with the other.
     */
    if( self->capture.pcm && self->capture.ready )
    {
        captureFrames = *numFrames;
        PA_ENSURE( PaAlsaStreamComponent_RegisterChannels( &self->capture, &self->bufferProcessor, &captureFrames,
                    &xrun ) );
    }
    if( self->playback.pcm && self->playback.ready )
    {
        playbackFrames = *numFrames;
        PA_ENSURE( PaAlsaStreamComponent_RegisterChannels( &self->playback, &self->bufferProcessor, &playbackFrames,
                    &xrun ) );
    }
    if( xrun )
    {
        /* Nothing more to do */
        assert( 0 == commonFrames );
        goto end;
    }

    commonFrames = PA_MIN( captureFrames, playbackFrames );
    /* assert( commonFrames <= *numFrames ); */
    if( commonFrames > *numFrames )
    {
        /* Hmmm ... how come there are more frames available than we requested!? Blah. */
        PA_DEBUG(( "%s: Common available frames are reported to be more than number requested: %lu, %lu, callbackMode: %d\n", __FUNCTION__,
                    commonFrames, *numFrames, self->callbackMode ));
        if( self->capture.pcm )
        {
            PA_DEBUG(( "%s: captureFrames: %lu, capture.ready: %d\n", __FUNCTION__, captureFrames, self->capture.ready ));
        }
        if( self->playback.pcm )
        {
            PA_DEBUG(( "%s: playbackFrames: %lu, playback.ready: %d\n", __FUNCTION__, playbackFrames, self->playback.ready ));
        }

        commonFrames = 0;
        goto end;
    }

    /* Inform PortAudio of the number of frames we got.
     * @concern FullDuplex We might be experiencing underflow in either end; if its an input underflow, we go on
     * with output. If its output underflow however, depending on the paNeverDropInput flag, we may want to simply
     * discard the excess input or call the callback with paOutputOverflow flagged.
     */
    if( self->capture.pcm )
    {
        if( self->capture.ready )
        {
            PaUtil_SetInputFrameCount( &self->bufferProcessor, commonFrames );
        }
        else
        {
            /* We have input underflow */
            PaUtil_SetNoInput( &self->bufferProcessor );
        }
    }
    if( self->playback.pcm )
    {
        if( self->playback.ready )
        {
            PaUtil_SetOutputFrameCount( &self->bufferProcessor, commonFrames );
        }
        else
        {
            /* We have output underflow, but keeping input data (paNeverDropInput) */
            assert( self->neverDropInput );
            assert( self->capture.pcm != NULL );
            PA_DEBUG(( "%s: Setting output buffers to NULL\n", __FUNCTION__ ));
            PaUtil_SetNoOutput( &self->bufferProcessor );
        }
    }

end:
    *numFrames = commonFrames;
error:
    if( xrun )
    {
        PA_ENSURE( PaAlsaStream_HandleXrun( self ) );
        *numFrames = 0;
    }
    *xrunOccurred = xrun;

    return result;
}